

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_double>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  _Alloc_hider _Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ios_info *this_00;
  uint64_t uVar6;
  ulong uVar7;
  streambuf_type *psVar8;
  ulong uVar9;
  uint uVar10;
  streambuf_type *psVar11;
  bool bVar12;
  iter_type iVar13;
  string_type tmp;
  cast_type value;
  
  psVar11 = end._M_sbuf;
  psVar8 = in._M_sbuf;
  uVar10 = in._M_c;
  plVar5 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                  0xffffffffffffffff);
  iVar4 = end._M_c;
  if (plVar5 != (long *)0x0) {
    this_00 = ios_info::get(ios);
    uVar6 = ios_info::display_flags(this_00);
    if ((uVar6 != 0) &&
       (formatter<char>::create((formatter<char> *)&tmp,ios,&this->loc_,&this->enc_),
       _Var1 = tmp._M_dataplus, tmp._M_dataplus._M_p != (pointer)0x0)) {
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      std::__cxx11::string::reserve((ulong)&tmp);
LAB_001902cd:
      uVar2 = uVar10;
      if (uVar10 == 0xffffffff && psVar8 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
          uVar2 = (uint)**(byte **)(psVar8 + 0x10);
        }
        else {
          uVar2 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
          if (uVar2 == 0xffffffff) {
            psVar8 = (streambuf_type *)0x0;
          }
        }
      }
      if (psVar11 == (streambuf_type *)0x0 || iVar4 != -1) {
        if ((iVar4 == -1) == (uVar2 == 0xffffffff)) goto LAB_00190562;
      }
      else if ((*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) ||
              (iVar3 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11), iVar3 != -1)) {
        if (uVar2 != 0xffffffff) goto LAB_00190562;
      }
      else {
        psVar11 = (streambuf_type *)0x0;
        if (uVar2 == 0xffffffff) goto LAB_00190562;
      }
      uVar2 = uVar10;
      if (psVar8 != (streambuf_type *)0x0 && uVar10 == 0xffffffff) {
        if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
          uVar2 = (uint)**(byte **)(psVar8 + 0x10);
        }
        else {
          uVar2 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
          if (uVar2 == 0xffffffff) {
            psVar8 = (streambuf_type *)0x0;
          }
        }
      }
      if ((char)uVar2 != '\x7f' && 0x1f < (byte)((char)uVar2 - 1U)) goto LAB_00190562;
      if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
        *(ulong *)(psVar8 + 0x10) = *(ulong *)(psVar8 + 0x10) + 1;
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = 0xffffffff;
        (**(code **)(*(long *)psVar8 + 0x50))(psVar8);
      }
      goto LAB_001902cd;
    }
  }
  iVar13 = (iter_type)
           std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                     (this,psVar8,uVar10,psVar11,end._8_8_ & 0xffffffff,ios,err,val);
  return iVar13;
LAB_00190562:
  if (0xfff < tmp._M_string_length) goto LAB_00190571;
  uVar2 = uVar10;
  if (uVar10 == 0xffffffff && psVar8 != (streambuf_type *)0x0) {
    if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
      uVar2 = (uint)**(byte **)(psVar8 + 0x10);
    }
    else {
      uVar2 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
      if (uVar2 == 0xffffffff) {
        psVar8 = (streambuf_type *)0x0;
      }
    }
  }
  if (psVar11 == (streambuf_type *)0x0 || iVar4 != -1) {
    if ((iVar4 == -1) == (uVar2 == 0xffffffff)) goto LAB_00190571;
  }
  else if ((*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) ||
          (iVar3 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11), iVar3 != -1)) {
    if (uVar2 != 0xffffffff) goto LAB_00190571;
  }
  else {
    psVar11 = (streambuf_type *)0x0;
    if (uVar2 == 0xffffffff) goto LAB_00190571;
  }
  if (psVar8 == (streambuf_type *)0x0 || uVar10 != 0xffffffff) {
LAB_0019049c:
    if ((char)uVar10 == '\n') goto LAB_00190571;
  }
  else {
    if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
      uVar10 = (uint)**(byte **)(psVar8 + 0x10);
      goto LAB_0019049c;
    }
    uVar10 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    if (uVar10 != 0xffffffff) goto LAB_0019049c;
    psVar8 = (streambuf_type *)0x0;
  }
  if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
    *(ulong *)(psVar8 + 0x10) = *(ulong *)(psVar8 + 0x10) + 1;
  }
  else {
    iVar3 = (**(code **)(*(long *)psVar8 + 0x50))(psVar8);
    if ((iVar3 == -1) && (*(ulong *)(psVar8 + 0x18) <= *(ulong *)(psVar8 + 0x10))) {
      (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    }
  }
  uVar10 = 0xffffffff;
  std::__cxx11::string::push_back((char)&tmp);
  goto LAB_00190562;
LAB_00190571:
  uVar7 = (**(code **)(*(long *)_Var1._M_p + 0x28))(_Var1._M_p,&tmp,&value);
  uVar9 = tmp._M_string_length;
  if (uVar7 == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = (longdouble)value;
  }
  for (; uVar7 < uVar9; uVar9 = uVar9 - 1) {
    std::istream::putback((char)plVar5);
  }
  psVar8 = *(streambuf_type **)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0xe8);
  if (psVar8 == (streambuf_type *)0x0) {
    bVar12 = true;
    psVar8 = (streambuf_type *)0x0;
  }
  else if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
    bVar12 = false;
  }
  else {
    iVar3 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    bVar12 = iVar3 == -1;
    if (bVar12) {
      psVar8 = (streambuf_type *)0x0;
    }
  }
  if (psVar11 == (streambuf_type *)0x0 || iVar4 != -1) {
    if ((iVar4 != -1) == bVar12) goto LAB_00190659;
  }
  else if (*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) {
    if (bVar12 != false) goto LAB_00190659;
  }
  else {
    iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    if (bVar12 != (iVar4 == -1)) goto LAB_00190659;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_00190659:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  iVar13._8_8_ = 0xffffffff;
  iVar13._M_sbuf = psVar8;
  return iVar13;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }